

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cost.c
# Opt level: O0

void av1_cost_tokens_from_cdf(int *costs,aom_cdf_prob *cdf,int *inv_map)

{
  int iVar1;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  aom_cdf_prob p15;
  aom_cdf_prob prev_cdf;
  int i;
  int iVar2;
  aom_cdf_prob p15_00;
  
  iVar2 = 0;
  while( true ) {
    p15_00 = (aom_cdf_prob)((uint)iVar2 >> 0x10);
    if (in_RDX == 0) {
      iVar1 = av1_cost_symbol(p15_00);
      *(int *)(in_RDI + (long)iVar2 * 4) = iVar1;
    }
    else {
      iVar1 = av1_cost_symbol(p15_00);
      *(int *)(in_RDI + (long)*(int *)(in_RDX + (long)iVar2 * 4) * 4) = iVar1;
    }
    if (*(short *)(in_RSI + (long)iVar2 * 2) == 0) break;
    iVar2 = iVar2 + 1;
  }
  return;
}

Assistant:

void av1_cost_tokens_from_cdf(int *costs, const aom_cdf_prob *cdf,
                              const int *inv_map) {
  int i;
  aom_cdf_prob prev_cdf = 0;
  for (i = 0;; ++i) {
    aom_cdf_prob p15 = AOM_ICDF(cdf[i]) - prev_cdf;
    p15 = (p15 < EC_MIN_PROB) ? EC_MIN_PROB : p15;
    prev_cdf = AOM_ICDF(cdf[i]);

    if (inv_map)
      costs[inv_map[i]] = av1_cost_symbol(p15);
    else
      costs[i] = av1_cost_symbol(p15);

    // Stop once we reach the end of the CDF
    if (cdf[i] == AOM_ICDF(CDF_PROB_TOP)) break;
  }
}